

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

bool __thiscall
psy::C::TypeChecker::satisfyIntegerTypeConstraint(TypeChecker *this,Type *ty,SyntaxNode *node)

{
  bool bVar1;
  SyntaxToken local_60;
  SyntaxNode *local_28;
  SyntaxNode *node_local;
  Type *ty_local;
  TypeChecker *this_local;
  
  local_28 = node;
  node_local = (SyntaxNode *)ty;
  ty_local = (Type *)this;
  bVar1 = isIntegerType(ty);
  if (!bVar1) {
    C::SyntaxNode::lastToken(&local_60,local_28);
    DiagnosticsReporter::ExpectedExpressionOfIntegerType(&this->diagReporter_,&local_60);
    SyntaxToken::~SyntaxToken(&local_60);
  }
  return bVar1;
}

Assistant:

bool TypeChecker::satisfyIntegerTypeConstraint(const Type* ty, const SyntaxNode* node)
{
    if (!isIntegerType(ty)) {
        diagReporter_.ExpectedExpressionOfIntegerType(node->lastToken());
        return false;
    }
    return true;
}